

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O1

bool dg::vr::unsetRelated(Bucket *lt,Type type,Bucket *rt)

{
  pointer *pprVar1;
  reference_wrapper<dg::vr::Bucket> *__src;
  reference_wrapper<dg::vr::Bucket> *prVar2;
  bool bVar3;
  uint uVar4;
  __normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
  __dest;
  VectorSet<std::reference_wrapper<dg::vr::Bucket>> *this;
  
  this = (VectorSet<std::reference_wrapper<dg::vr::Bucket>> *)((lt->relatedBuckets)._M_elems + type)
  ;
  if (lt->id == rt->id) {
    bVar3 = VectorSet<std::reference_wrapper<dg::vr::Bucket>>::erase<dg::vr::Bucket,bool>(this,rt);
    return bVar3;
  }
  uVar4 = dg::vr::Relations::inverted(type);
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<std::reference_wrapper<dg::vr::Bucket>*,std::vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>>,__gnu_cxx::__ops::_Iter_equals_val<dg::vr::Bucket_const>>
                     (*(undefined8 *)this,
                      (lt->relatedBuckets)._M_elems[type].vec.
                      super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,rt);
  prVar2 = (lt->relatedBuckets)._M_elems[type].vec.
           super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__dest._M_current != prVar2) {
    __src = __dest._M_current + 1;
    if (__src != prVar2) {
      memmove(__dest._M_current,__src,(long)prVar2 - (long)__src);
    }
    pprVar1 = &(lt->relatedBuckets)._M_elems[type].vec.
               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pprVar1 = *pprVar1 + -1;
    VectorSet<std::reference_wrapper<dg::vr::Bucket>>::erase<dg::vr::Bucket,bool>
              ((VectorSet<std::reference_wrapper<dg::vr::Bucket>> *)
               ((rt->relatedBuckets)._M_elems + uVar4),lt);
  }
  return __dest._M_current != prVar2;
}

Assistant:

bool unsetRelated(Bucket &lt, Relations::Type type, Bucket &rt) {
        assert(type != Relations::EQ);
        if (lt == rt) {
            return lt.relatedBuckets[type].erase(rt);
        }
        auto &ltRelated = lt.relatedBuckets[type];
        auto &rtRelated = rt.relatedBuckets[Relations::inverted(type)];

        auto found = ltRelated.find(rt);
        if (found == ltRelated.end()) {
            assert(!rtRelated.contains(lt));
            return false;
        }

        ltRelated.erase(found);
        rtRelated.erase(lt);
        return true;
    }